

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void Assimp::BaseImporter::ConvertUTF8toISO8859_1(string *data)

{
  undefined1 uVar1;
  char cVar2;
  byte *pbVar3;
  undefined1 *puVar4;
  char *pcVar5;
  ostream *poVar6;
  Logger *pLVar7;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  long local_28;
  size_t j;
  size_t i;
  size_t size;
  string *data_local;
  
  size = (size_t)data;
  i = std::__cxx11::string::size();
  local_28 = 0;
  for (j = 0; j < i; j = j + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[](size);
    if (*pbVar3 < 0x80) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
      uVar1 = *puVar4;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
      *puVar4 = uVar1;
    }
    else if (j < i - 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[](size);
      if (*pcVar5 == -0x3e) {
        j = j + 1;
        puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
        uVar1 = *puVar4;
        puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
        *puVar4 = uVar1;
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::operator[](size);
        if (*pcVar5 == -0x3d) {
          j = j + 1;
          pcVar5 = (char *)std::__cxx11::string::operator[](size);
          cVar2 = *pcVar5;
          pcVar5 = (char *)std::__cxx11::string::operator[](size);
          *pcVar5 = cVar2 + '@';
        }
        else {
          std::__cxx11::stringstream::stringstream(local_1b0);
          poVar6 = std::operator<<(local_1a0,"UTF8 code ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
          pcVar5 = (char *)std::__cxx11::string::operator[](size);
          poVar6 = std::operator<<(poVar6,*pcVar5);
          pcVar5 = (char *)std::__cxx11::string::operator[](size);
          poVar6 = std::operator<<(poVar6,*pcVar5);
          std::operator<<(poVar6," can not be converted into ISA-8859-1.");
          pLVar7 = DefaultLogger::get();
          std::__cxx11::stringstream::str();
          Logger::error(pLVar7,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          j = j + 1;
          puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
          uVar1 = *puVar4;
          local_28 = local_28 + 1;
          puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
          *puVar4 = uVar1;
          puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
          uVar1 = *puVar4;
          puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
          *puVar4 = uVar1;
          std::__cxx11::stringstream::~stringstream(local_1b0);
        }
      }
    }
    else {
      pLVar7 = DefaultLogger::get();
      Logger::error(pLVar7,"UTF8 code but only one character remaining");
      puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
      uVar1 = *puVar4;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[](size);
      *puVar4 = uVar1;
    }
    local_28 = local_28 + 1;
  }
  std::__cxx11::string::resize(size);
  return;
}

Assistant:

void BaseImporter::ConvertUTF8toISO8859_1(std::string& data)
{
    size_t size = data.size();
    size_t i = 0, j = 0;

    while(i < size) {
        if ((unsigned char) data[i] < (size_t) 0x80) {
            data[j] = data[i];
        } else if(i < size - 1) {
            if((unsigned char) data[i] == 0xC2) {
                data[j] = data[++i];
            } else if((unsigned char) data[i] == 0xC3) {
                data[j] = ((unsigned char) data[++i] + 0x40);
            } else {
                std::stringstream stream;
                stream << "UTF8 code " << std::hex << data[i] << data[i + 1] << " can not be converted into ISA-8859-1.";
                ASSIMP_LOG_ERROR( stream.str() );

                data[j++] = data[i++];
                data[j] = data[i];
            }
        } else {
            ASSIMP_LOG_ERROR("UTF8 code but only one character remaining");

            data[j] = data[i];
        }

        i++; j++;
    }

    data.resize(j);
}